

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_NonMaximumSuppression_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0041e198 == '\x01') {
    DAT_0041e198 = '\0';
    (*(code *)*_NonMaximumSuppression_PickTop_default_instance_)();
  }
  if (DAT_0041e210 == '\x01') {
    DAT_0041e210 = 0;
    (*(code *)*_NonMaximumSuppression_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _NonMaximumSuppression_PickTop_default_instance_.Shutdown();
  _NonMaximumSuppression_default_instance_.Shutdown();
}